

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O1

size_t __thiscall prometheus::detail::LabelHasher::operator()(LabelHasher *this,Labels *labels)

{
  size_t sVar1;
  size_t sVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  ulong uVar5;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_32;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_31;
  
  p_Var3 = (labels->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(labels->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 == p_Var4) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    do {
      sVar1 = std::
              hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()(&local_32,(string *)(p_Var3 + 1));
      uVar5 = sVar2 * 0x40 + 0x9e3779b9 + (sVar2 >> 2) + sVar1 ^ sVar2;
      sVar2 = std::
              hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()(&local_31,(string *)(p_Var3 + 2));
      sVar2 = (uVar5 >> 2) + uVar5 * 0x40 + sVar2 + 0x9e3779b9 ^ uVar5;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return sVar2;
}

Assistant:

std::size_t LabelHasher::operator()(const Labels& labels) const {
  std::size_t seed = 0;
  for (auto& label : labels) {
    hash_combine(&seed, label.first, label.second);
  }

  return seed;
}